

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

parasail_matrix_t *
parasail_matrix_convert_square_to_pssm(parasail_matrix_t *matrix,char *s1,int s1Len)

{
  int iVar1;
  size_t __size;
  int *__dest;
  size_t __size_00;
  int *piVar2;
  char *__dest_00;
  char *__dest_01;
  size_t _size_4;
  size_t _size_3;
  size_t _size_2;
  size_t _size_1;
  size_t _size;
  int i;
  char *new_query;
  char *new_alphabet;
  int *new_matrix;
  int *new_mapper;
  size_t alphabet_size;
  size_t matrix_size;
  parasail_matrix_t *retval;
  int s1Len_local;
  char *s1_local;
  parasail_matrix_t *matrix_local;
  
  iVar1 = matrix->size;
  __size = (size_t)(matrix->size + 1);
  if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_matrix_convert_square_to_pssm","matrix");
    matrix_local = (parasail_matrix_t *)0x0;
  }
  else if (matrix->type == 0) {
    matrix_local = (parasail_matrix_t *)malloc(0x48);
    if (matrix_local == (parasail_matrix_t *)0x0) {
      fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_convert_square_to_pssm",
              0x48);
      matrix_local = (parasail_matrix_t *)0x0;
    }
    else {
      __dest = (int *)malloc(0x400);
      if (__dest == (int *)0x0) {
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_convert_square_to_pssm",
                0x400);
        matrix_local = (parasail_matrix_t *)0x0;
      }
      else {
        memcpy(__dest,matrix->mapper,0x400);
        __size_00 = (long)(iVar1 * s1Len) << 2;
        piVar2 = (int *)malloc(__size_00);
        if (piVar2 == (int *)0x0) {
          fprintf(_stderr,"%s: failed to malloc %zu bytes\n",
                  "parasail_matrix_convert_square_to_pssm",__size_00);
          matrix_local = (parasail_matrix_t *)0x0;
        }
        else {
          __dest_00 = (char *)malloc(__size);
          if (__dest_00 == (char *)0x0) {
            fprintf(_stderr,"%s: failed to malloc %zu bytes\n",
                    "parasail_matrix_convert_square_to_pssm",__size);
            matrix_local = (parasail_matrix_t *)0x0;
          }
          else {
            memcpy(__dest_00,matrix->alphabet,__size);
            __dest_01 = (char *)malloc((long)(s1Len + 1));
            if (__dest_01 == (char *)0x0) {
              fprintf(_stderr,"%s: failed to malloc %zu bytes\n",
                      "parasail_matrix_convert_square_to_pssm",(long)(s1Len + 1));
              matrix_local = (parasail_matrix_t *)0x0;
            }
            else {
              memcpy(__dest_01,s1,(long)(s1Len + 1));
              for (_size._4_4_ = 0; _size._4_4_ < s1Len; _size._4_4_ = _size._4_4_ + 1) {
                memcpy(piVar2 + matrix->size * _size._4_4_,
                       matrix->matrix + matrix->size * matrix->mapper[(byte)s1[_size._4_4_]],
                       (long)matrix->size << 2);
              }
              matrix_local->name = matrix->name;
              matrix_local->matrix = piVar2;
              matrix_local->mapper = __dest;
              matrix_local->size = matrix->size;
              matrix_local->max = matrix->max;
              matrix_local->min = matrix->min;
              matrix_local->user_matrix = piVar2;
              matrix_local->type = 1;
              matrix_local->length = s1Len;
              matrix_local->alphabet = __dest_00;
              matrix_local->query = __dest_01;
            }
          }
        }
      }
    }
  }
  else {
    fprintf(_stderr,"%s: attempted to convert non-square matrix to pssm\n",
            "parasail_matrix_convert_square_to_pssm");
    matrix_local = (parasail_matrix_t *)0x0;
  }
  return matrix_local;
}

Assistant:

parasail_matrix_t* parasail_matrix_convert_square_to_pssm(
        const parasail_matrix_t *matrix,
        const char *s1,
        int s1Len)
{
    parasail_matrix_t *retval = NULL;
    size_t matrix_size = matrix->size*s1Len;
    size_t alphabet_size = matrix->size+1;
    int *new_mapper = NULL;
    int *new_matrix = NULL;
    char *new_alphabet = NULL;
    char *new_query = NULL;
    int i;

    PARASAIL_CHECK_NULL(matrix);

    if (matrix->type != PARASAIL_MATRIX_TYPE_SQUARE) {
        fprintf(stderr, "%s: attempted to convert non-square matrix to pssm\n", __func__);
        return NULL;
    }

    PARASAIL_NEW(retval, parasail_matrix_t);

    PARASAIL_CALLOC(new_mapper, int, 256);
    (void)memcpy(new_mapper, matrix->mapper, sizeof(int)*256);

    PARASAIL_CALLOC(new_matrix, int, matrix_size);

    PARASAIL_CALLOC(new_alphabet, char, alphabet_size);
    (void)memcpy(new_alphabet, matrix->alphabet, sizeof(char)*alphabet_size);

    PARASAIL_CALLOC(new_query, char, s1Len+1);
    (void)memcpy(new_query, s1, sizeof(char)*(s1Len+1));

    for (i=0; i<s1Len; ++i) {
        (void)memcpy(
                &new_matrix[matrix->size*i],
                &matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[i]]],
                sizeof(int)*matrix->size);
    }

    retval->name = matrix->name;
    retval->matrix = new_matrix;
    retval->mapper = new_mapper;
    retval->size = matrix->size;
    retval->max = matrix->max;
    retval->min = matrix->min;
    retval->user_matrix = new_matrix;
    retval->type = PARASAIL_MATRIX_TYPE_PSSM;
    retval->length = s1Len;
    retval->alphabet = new_alphabet;
    retval->query = new_query;

    return retval;
}